

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O3

int __thiscall smf::Binasc::writeToBinary(Binasc *this,ostream *out,istream *input)

{
  int iVar1;
  int lineCount;
  string inputLine;
  string local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::reserve((ulong)&local_50);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(input,(string *)&local_50,'\n');
  lineCount = 1;
  if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0) {
    do {
      iVar1 = processLine(this,out,&local_50,lineCount);
      if (iVar1 == 0) {
        lineCount = 0;
        goto LAB_00121c69;
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>(input,(string *)&local_50,'\n')
      ;
      lineCount = lineCount + 1;
    } while (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0);
    lineCount = 1;
  }
LAB_00121c69:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return lineCount;
}

Assistant:

int Binasc::writeToBinary(std::ostream& out, std::istream& input) {
	std::string inputLine;
	inputLine.reserve(8196);
	int  lineNum = 0;              // current line number
	getline(input, inputLine, '\n');
	lineNum++;
	while (!input.eof()) {
		int status = processLine(out, inputLine, lineNum);
		if (!status) {
			return 0;
		}
		getline(input, inputLine, '\n');
		lineNum++;
	}
	return 1;
}